

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3VdbeSerialPut(u8 *buf,Mem *pMem,u32 serial_type)

{
  uint local_34;
  ulong uStack_30;
  u32 i;
  u64 v;
  u32 len;
  u32 serial_type_local;
  Mem *pMem_local;
  u8 *buf_local;
  
  if ((serial_type < 8) && (serial_type != 0)) {
    if (serial_type == 7) {
      uStack_30 = (pMem->u).i;
    }
    else {
      uStack_30 = (pMem->u).i;
    }
    buf_local._4_4_ = (uint)""[serial_type];
    local_34 = buf_local._4_4_;
    do {
      local_34 = local_34 - 1;
      buf[local_34] = (u8)uStack_30;
      uStack_30 = uStack_30 >> 8;
    } while (local_34 != 0);
  }
  else if (serial_type < 0xc) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = pMem->n;
    if (buf_local._4_4_ != 0) {
      memcpy(buf,pMem->z,(ulong)buf_local._4_4_);
    }
  }
  return buf_local._4_4_;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3VdbeSerialPut(u8 *buf, Mem *pMem, u32 serial_type){
  u32 len;

  /* Integer and Real */
  if( serial_type<=7 && serial_type>0 ){
    u64 v;
    u32 i;
    if( serial_type==7 ){
      assert( sizeof(v)==sizeof(pMem->u.r) );
      memcpy(&v, &pMem->u.r, sizeof(v));
      swapMixedEndianFloat(v);
    }else{
      v = pMem->u.i;
    }
    len = i = sqlite3SmallTypeSizes[serial_type];
    assert( i>0 );
    do{
      buf[--i] = (u8)(v&0xFF);
      v >>= 8;
    }while( i );
    return len;
  }

  /* String or blob */
  if( serial_type>=12 ){
    assert( pMem->n + ((pMem->flags & MEM_Zero)?pMem->u.nZero:0)
             == (int)sqlite3VdbeSerialTypeLen(serial_type) );
    len = pMem->n;
    if( len>0 ) memcpy(buf, pMem->z, len);
    return len;
  }

  /* NULL or constants 0 or 1 */
  return 0;
}